

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_useRowMatchFinderMode_e ZVar1;
  ZSTD_CCtx_params *in_RDI;
  bool bVar2;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000014;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  
  if (in_RDI != (ZSTD_CCtx_params *)0x0) {
    memset(in_RDI,0,0xb0);
    in_RDI->compressionLevel = 3;
    (in_RDI->fParams).contentSizeFlag = 1;
  }
  (in_RDI->cParams).searchLog = in_stack_00000014;
  (in_RDI->cParams).minMatch = in_stack_00000018;
  (in_RDI->cParams).targetLength = in_stack_0000001c;
  (in_RDI->cParams).strategy = cParams.windowLog;
  (in_RDI->cParams).windowLog = in_stack_00000008;
  (in_RDI->cParams).chainLog = in_stack_0000000c;
  (in_RDI->cParams).hashLog = in_stack_00000010;
  (in_RDI->cParams).searchLog = in_stack_00000014;
  if (6 < cParams.windowLog) {
    if (in_stack_00000008 < 0x1b) {
      bVar2 = false;
    }
    else {
      (in_RDI->ldmParams).enableLdm = 1;
      ZSTD_ldm_adjustParameters(&in_RDI->ldmParams,(ZSTD_compressionParameters *)&stack0x00000008);
      bVar2 = cParams.windowLog < 7;
    }
    if ((!bVar2) && (0x10 < in_stack_00000008)) {
      in_RDI->splitBlocks = 1;
    }
  }
  ZVar1 = ZSTD_resolveRowMatchFinderMode
                    (in_RDI->useRowMatchFinder,(ZSTD_compressionParameters *)&stack0x00000008);
  in_RDI->useRowMatchFinder = ZVar1;
  return in_RDI;
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    /* should not matter, as all cParams are presumed properly defined */
    ZSTD_CCtxParams_init(&cctxParams, ZSTD_CLEVEL_DEFAULT);
    cctxParams.cParams = cParams;

    /* Adjust advanced params according to cParams */
    if (ZSTD_CParams_shouldEnableLdm(&cParams)) {
        DEBUGLOG(4, "ZSTD_makeCCtxParamsFromCParams(): Including LDM into cctx params");
        cctxParams.ldmParams.enableLdm = 1;
        /* LDM is enabled by default for optimal parser and window size >= 128MB */
        ZSTD_ldm_adjustParameters(&cctxParams.ldmParams, &cParams);
        assert(cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog);
        assert(cctxParams.ldmParams.hashRateLog < 32);
    }

    if (ZSTD_CParams_useBlockSplitter(&cParams)) {
        DEBUGLOG(4, "ZSTD_makeCCtxParamsFromCParams(): Including block splitting into cctx params");
        cctxParams.splitBlocks = 1;
    }

    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);
    assert(!ZSTD_checkCParams(cParams));
    return cctxParams;
}